

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

void __thiscall
IRT::CStatementList::CStatementList
          (CStatementList *this,
          unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *statement)

{
  pointer *__ptr;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_18;
  
  (this->super_CStatement).super_IStatement.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00183100;
  (this->statements).
  super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->statements).
  super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->statements).
  super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18._M_head_impl =
       (statement->_M_t).
       super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
       super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
  (statement->_M_t).
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)0x0;
  std::
  vector<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::allocator<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>
  ::emplace_back<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>
            ((vector<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::allocator<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>
              *)&this->statements,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_18);
  if (local_18._M_head_impl != (CStatement *)0x0) {
    (*((local_18._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  return;
}

Assistant:

CStatementList::CStatementList( std::unique_ptr<const CStatement> &statement ) {
    Add( std::move(statement) );
}